

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaStringBuilder::AddNumber(VmaStringBuilder *this,uint64_t num)

{
  bool bVar1;
  char *pStr;
  char buf [21];
  
  pStr = buf + 0x14;
  buf[0x14] = '\0';
  do {
    pStr[-1] = (byte)(num % 10) | 0x30;
    pStr = pStr + -1;
    bVar1 = 9 < num;
    num = num / 10;
  } while (bVar1);
  Add(this,pStr);
  return;
}

Assistant:

void VmaStringBuilder::AddNumber(uint64_t num)
{
    char buf[21];
    buf[20] = '\0';
    char* p = &buf[20];
    do
    {
        *--p = '0' + (num % 10);
        num /= 10;
    } while (num);
    Add(p);
}